

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O1

ze_result_t
zeGetRTASBuilderProcAddrTable(ze_api_version_t version,ze_rtas_builder_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_rtas_builder_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((tracing_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((tracing_layer::context & 0xffff) <= (version & 0xffff))) {
      DAT_0017f130 = pDdiTable->pfnCreateExt;
      pDdiTable->pfnCreateExt = tracing_layer::zeRTASBuilderCreateExt;
      DAT_0017f138 = pDdiTable->pfnGetBuildPropertiesExt;
      pDdiTable->pfnGetBuildPropertiesExt = tracing_layer::zeRTASBuilderGetBuildPropertiesExt;
      DAT_0017f140 = pDdiTable->pfnBuildExt;
      pDdiTable->pfnBuildExt = tracing_layer::zeRTASBuilderBuildExt;
      DAT_0017f148 = pDdiTable->pfnCommandListAppendCopyExt;
      pDdiTable->pfnCommandListAppendCopyExt = tracing_layer::zeRTASBuilderCommandListAppendCopyExt;
      DAT_0017f150 = pDdiTable->pfnDestroyExt;
      pDdiTable->pfnDestroyExt = tracing_layer::zeRTASBuilderDestroyExt;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetRTASBuilderProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_rtas_builder_dditable_t* pDdiTable           ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = tracing_layer::context.zeDdiTable.RTASBuilder;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(tracing_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(tracing_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreateExt                                = pDdiTable->pfnCreateExt;
    pDdiTable->pfnCreateExt                              = tracing_layer::zeRTASBuilderCreateExt;

    dditable.pfnGetBuildPropertiesExt                    = pDdiTable->pfnGetBuildPropertiesExt;
    pDdiTable->pfnGetBuildPropertiesExt                  = tracing_layer::zeRTASBuilderGetBuildPropertiesExt;

    dditable.pfnBuildExt                                 = pDdiTable->pfnBuildExt;
    pDdiTable->pfnBuildExt                               = tracing_layer::zeRTASBuilderBuildExt;

    dditable.pfnCommandListAppendCopyExt                 = pDdiTable->pfnCommandListAppendCopyExt;
    pDdiTable->pfnCommandListAppendCopyExt               = tracing_layer::zeRTASBuilderCommandListAppendCopyExt;

    dditable.pfnDestroyExt                               = pDdiTable->pfnDestroyExt;
    pDdiTable->pfnDestroyExt                             = tracing_layer::zeRTASBuilderDestroyExt;

    return result;
}